

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O0

void __thiscall FileList::Entry::Entry(Entry *this,path *path)

{
  path *this_00;
  path local_38;
  path *local_18;
  path *path_local;
  Entry *this_local;
  
  local_18 = path;
  path_local = &this->_path;
  ghc::filesystem::path::path(&this->_path,path);
  this_00 = local_18;
  ghc::filesystem::current_path();
  ghc::filesystem::path::lexically_proximate(&this->_relativePath,this_00,&local_38);
  ghc::filesystem::path::~path(&local_38);
  ghc::filesystem::path::u8string_abi_cxx11_(&this->_string,&this->_path);
  ghc::filesystem::path::generic_u8string_abi_cxx11_(&this->_relativeString,&this->_relativePath);
  return;
}

Assistant:

FileList::Entry::Entry(const fs::path &path) :
	_path(path),
	_relativePath(path.lexically_proximate(fs::current_path())),
	_string(_path.u8string()),
	_relativeString(_relativePath.generic_u8string())
{
}